

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int propagateConstantExprRewriteOne(WhereConst *pConst,Expr *pExpr,int bIgnoreAffBlob)

{
  char cVar1;
  Expr **ppEVar2;
  Expr *pEVar3;
  uint uVar4;
  long lVar5;
  
  if (*pConst->pOomFault == '\0') {
    if (pExpr->op != 0xa7) {
      return 0;
    }
    uVar4 = pExpr->flags;
    if (((pConst->mExcludeOn | 0x20) & uVar4) != 0) {
      return 0;
    }
    if (0 < (long)pConst->nConst) {
      ppEVar2 = pConst->apExpr;
      lVar5 = 0;
      do {
        pEVar3 = *(Expr **)((long)ppEVar2 + lVar5);
        if (((pEVar3 != pExpr) && (pEVar3->iTable == pExpr->iTable)) &&
           (pEVar3->iColumn == pExpr->iColumn)) {
          if (bIgnoreAffBlob != 0) {
            cVar1 = sqlite3ExprAffinity(pEVar3);
            if (cVar1 == 'A') {
              return 1;
            }
            uVar4 = pExpr->flags;
            ppEVar2 = pConst->apExpr;
          }
          pConst->nChng = pConst->nChng + 1;
          pExpr->flags = uVar4 & 0xff7fffdf | 0x20;
          pEVar3 = *(Expr **)((long)ppEVar2 + lVar5 + 8);
          if (pEVar3 == (Expr *)0x0) {
            pEVar3 = (Expr *)0x0;
          }
          else {
            pEVar3 = exprDup(pConst->pParse->db,pEVar3,0,(u8 **)0x0);
          }
          pExpr->pLeft = pEVar3;
          return 1;
        }
        lVar5 = lVar5 + 0x10;
      } while ((long)pConst->nConst * 0x10 != lVar5);
    }
  }
  return 1;
}

Assistant:

static int propagateConstantExprRewriteOne(
  WhereConst *pConst,
  Expr *pExpr,
  int bIgnoreAffBlob
){
  int i;
  if( pConst->pOomFault[0] ) return WRC_Prune;
  if( pExpr->op!=TK_COLUMN ) return WRC_Continue;
  if( ExprHasProperty(pExpr, EP_FixedCol|pConst->mExcludeOn) ){
    testcase( ExprHasProperty(pExpr, EP_FixedCol) );
    testcase( ExprHasProperty(pExpr, EP_OuterON) );
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    return WRC_Continue;
  }
  for(i=0; i<pConst->nConst; i++){
    Expr *pColumn = pConst->apExpr[i*2];
    if( pColumn==pExpr ) continue;
    if( pColumn->iTable!=pExpr->iTable ) continue;
    if( pColumn->iColumn!=pExpr->iColumn ) continue;
    if( bIgnoreAffBlob && sqlite3ExprAffinity(pColumn)==SQLITE_AFF_BLOB ){
      break;
    }
    /* A match is found.  Add the EP_FixedCol property */
    pConst->nChng++;
    ExprClearProperty(pExpr, EP_Leaf);
    ExprSetProperty(pExpr, EP_FixedCol);
    assert( pExpr->pLeft==0 );
    pExpr->pLeft = sqlite3ExprDup(pConst->pParse->db, pConst->apExpr[i*2+1], 0);
    if( pConst->pParse->db->mallocFailed ) return WRC_Prune;
    break;
  }
  return WRC_Prune;
}